

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wtmath.c
# Opt level: O2

void idwt_sym_stride(double *cA,int len_cA,double *cD,double *lpr,double *hpr,int lpr_len,double *X,
                    int istride,int ostride)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  lVar1 = (long)istride;
  uVar4 = 0;
  uVar2 = 0;
  if (0 < len_cA) {
    uVar2 = (ulong)(uint)len_cA;
  }
  lVar10 = -1;
  lVar6 = -2;
  for (; uVar4 != uVar2; uVar4 = uVar4 + 1) {
    lVar6 = lVar6 + 2;
    lVar10 = lVar10 + 2;
    lVar7 = lVar6 * ostride;
    X[lVar7] = 0.0;
    lVar11 = lVar10 * ostride;
    X[lVar11] = 0.0;
    lVar5 = 0;
    lVar8 = 8;
    uVar3 = uVar4;
    for (lVar9 = 0; lVar9 < lpr_len / 2; lVar9 = lVar9 + 1) {
      if ((long)uVar3 < (long)len_cA && -1 < (long)uVar3) {
        X[lVar7] = *(double *)((long)lpr + lVar8 + -8) * *(double *)((long)cA + lVar5) +
                   *(double *)((long)hpr + lVar8 + -8) * *(double *)((long)cD + lVar5) + X[lVar7];
        X[lVar11] = *(double *)((long)lpr + lVar8) * *(double *)((long)cA + lVar5) +
                    *(double *)((long)hpr + lVar8) * *(double *)((long)cD + lVar5) + X[lVar11];
      }
      lVar8 = lVar8 + 0x10;
      uVar3 = uVar3 - 1;
      lVar5 = lVar5 + lVar1 * -8;
    }
    cA = cA + lVar1;
    cD = cD + lVar1;
  }
  return;
}

Assistant:

void idwt_sym_stride(double *cA, int len_cA, double *cD, double *lpr, double *hpr, int lpr_len, double *X, int istride, int ostride) {
	int len_avg, i, l, m, n, t, v;
	int ms, ns, is;
	len_avg = lpr_len;
	m = -2;
	n = -1;

	for (v = 0; v < len_cA; ++v) {
		i = v;
		m += 2;
		n += 2;
		ms = m * ostride;
		ns = n * ostride;
		X[ms] = 0.0;
		X[ns] = 0.0;
		for (l = 0; l < len_avg / 2; ++l) {
			t = 2 * l;
			if ((i - l) >= 0 && (i - l) < len_cA) {
				is = (i - l) * istride;
				X[ms] += lpr[t] * cA[is] + hpr[t] * cD[is];
				X[ns] += lpr[t + 1] * cA[is] + hpr[t + 1] * cD[is];
			}
		}
	}
}